

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewwidget.cpp
# Opt level: O3

void __thiscall
QPrintPreviewWidgetPrivate::setCurrentPage(QPrintPreviewWidgetPrivate *this,int pageNumber)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  QPointF local_78 [5];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((0 < pageNumber) && (uVar2 = (this->pages).d.size, (uint)pageNumber <= uVar2)) {
    uVar1 = this->curPage;
    this->curPage = pageNumber;
    if (uVar1 <= uVar2 && (0 < (int)uVar1 && uVar1 != pageNumber)) {
      if (this->zoomMode == FitInView) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QGraphicsView::centerOn((QGraphicsItem *)this->graphicsView);
          return;
        }
        goto LAB_0013bcb5;
      }
      iVar3 = QAbstractScrollArea::horizontalScrollBar();
      iVar4 = QAbstractScrollArea::verticalScrollBar();
      QGraphicsView::transform();
      QGraphicsItem::pos();
      QTransform::map(local_78);
      QAbstractSlider::setValue(iVar4);
      QAbstractSlider::setValue(iVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_0013bcb5:
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewWidgetPrivate::setCurrentPage(int pageNumber)
{
    if (pageNumber < 1 || pageNumber > pages.size())
        return;

    int lastPage = curPage;
    curPage = pageNumber;

    if (lastPage != curPage && lastPage > 0 && lastPage <= pages.size()) {
        if (zoomMode != QPrintPreviewWidget::FitInView) {
            QScrollBar *hsc = graphicsView->horizontalScrollBar();
            QScrollBar *vsc = graphicsView->verticalScrollBar();
            QPointF pt = graphicsView->transform().map(pages.at(curPage-1)->pos());
            vsc->setValue(int(pt.y()) - 10);
            hsc->setValue(int(pt.x()) - 10);
        } else {
            graphicsView->centerOn(pages.at(curPage-1));
        }
    }
}